

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# importer.cpp
# Opt level: O0

void __thiscall Importer_create_Test::TestBody(Importer_create_Test *this)

{
  bool bVar1;
  char *pcVar2;
  AssertHelper local_58 [8];
  Message local_50 [24];
  void *local_38;
  undefined1 local_30 [8];
  AssertionResult gtest_ar;
  ImporterPtr importer;
  Importer_create_Test *this_local;
  
  libcellml::Importer::create(SUB81(&gtest_ar.message_,0));
  local_38 = (void *)0x0;
  testing::internal::CmpHelperNE<decltype(nullptr),std::shared_ptr<libcellml::Importer>>
            ((internal *)local_30,"nullptr","importer",&local_38,
             (shared_ptr<libcellml::Importer> *)&gtest_ar.message_);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_30);
  if (!bVar1) {
    testing::Message::Message(local_50);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_30);
    testing::internal::AssertHelper::AssertHelper
              (local_58,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/importer/importer.cpp"
               ,0x1a,pcVar2);
    testing::internal::AssertHelper::operator=(local_58,local_50);
    testing::internal::AssertHelper::~AssertHelper(local_58);
    testing::Message::~Message(local_50);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_30);
  std::shared_ptr<libcellml::Importer>::~shared_ptr
            ((shared_ptr<libcellml::Importer> *)&gtest_ar.message_);
  return;
}

Assistant:

TEST(Importer, create)
{
    auto importer = libcellml::Importer::create();
    EXPECT_NE(nullptr, importer);
}